

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall
xatlas::internal::param::Atlas::addMesh(Atlas *this,TaskScheduler *taskScheduler,Mesh *mesh)

{
  ArrayBase *this_00;
  ArrayBase *this_01;
  TaskGroupHandle handle;
  int iVar1;
  long *plVar2;
  uint8_t *puVar3;
  ulong uVar4;
  undefined2 uVar5;
  uint32_t reserveSize;
  long lVar6;
  Task task;
  TaskGroupHandle taskGroup;
  ArrayBase local_70;
  ArrayBase local_58;
  pthread_mutex_t *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  local_70.buffer = (uint8_t *)0x0;
  local_70.elementSize = 8;
  local_70.capacity = 0;
  local_40 = (pthread_mutex_t *)this;
  if ((mesh->m_flags & 1) == 0) {
LAB_001ab292:
    __assert_fail("m_flags & MeshFlags::HasFaceGroups",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0xbac,"uint32_t xatlas::internal::Mesh::faceGroupCount() const");
  }
  local_70.size = (uint)(mesh->m_ignoredFaceCount != 0) + (mesh->m_faceGroupFaceCounts).m_base.size;
  if (local_70.size == 0) {
    local_58.buffer = (uint8_t *)0x0;
    local_58.elementSize = 0x18;
    local_58.size = 0;
    local_58.capacity = 0;
    reserveSize = 0;
  }
  else {
    ArrayBase::setArrayCapacity(&local_70,local_70.size);
    local_58.buffer = (uint8_t *)0x0;
    local_58.elementSize = 0x18;
    local_58.capacity = 0;
    local_58.size = local_70.size;
    reserveSize = 0;
    if (local_70.size != 0) {
      ArrayBase::setArrayCapacity(&local_58,local_70.size);
      if ((ulong)local_70.size != 0) {
        plVar2 = (long *)(local_58.buffer + 0x10);
        uVar4 = 0;
        puVar3 = local_70.buffer;
        do {
          if ((local_58._12_8_ & 0xffffffff) == uVar4) goto LAB_001ab273;
          *plVar2 = (long)puVar3;
          if ((mesh->m_flags & 1) == 0) goto LAB_001ab292;
          uVar5 = 0xffff;
          if (uVar4 < (mesh->m_faceGroupFaceCounts).m_base.size) {
            uVar5 = (undefined2)uVar4;
          }
          *(undefined2 *)(plVar2 + -2) = uVar5;
          *(int *)((long)plVar2 + -0xc) = (int)uVar4;
          plVar2[-1] = (long)mesh;
          uVar4 = uVar4 + 1;
          plVar2 = plVar2 + 3;
          puVar3 = puVar3 + 8;
          reserveSize = local_70.size;
        } while (local_70.size != uVar4);
      }
    }
  }
  handle = TaskScheduler::createTaskGroup(taskScheduler,reserveSize);
  local_34 = handle.value;
  if (local_70.size != 0) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      if ((local_58._12_8_ & 0xffffffff) <= uVar4) {
LAB_001ab273:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,
                      "T &xatlas::internal::Array<xatlas::internal::param::CreateChartGroupTaskArgs>::operator[](uint32_t) [T = xatlas::internal::param::CreateChartGroupTaskArgs]"
                     );
      }
      task.userData = local_58.buffer + lVar6;
      task.func = runCreateChartGroupTask;
      TaskScheduler::run(taskScheduler,handle,task);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar4 < local_70.size);
  }
  TaskScheduler::wait(taskScheduler,&local_34);
  iVar1 = pthread_mutex_lock(local_40);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (local_70.size != 0) {
    this_00 = (ArrayBase *)((long)local_40 + 0x30);
    this_01 = (ArrayBase *)((long)local_40 + 0x68);
    lVar6 = 0;
    uVar4 = 0;
    do {
      ArrayBase::push_back(this_00,local_70.buffer + lVar6);
      local_38 = mesh->m_id;
      ArrayBase::push_back(this_01,(uint8_t *)&local_38);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar4 < local_70.size);
  }
  local_40[1].__data.__lock = local_40[1].__data.__lock + 1;
  pthread_mutex_unlock(local_40);
  ArrayBase::~ArrayBase(&local_58);
  ArrayBase::~ArrayBase(&local_70);
  return;
}

Assistant:

void addMesh(TaskScheduler *taskScheduler, const Mesh *mesh)
	{
		// Create one chart group per face group.
		// If there's any ignored faces in the mesh, create an extra face group for that (vertex map).
		// Chart group creation is slow since it copies a chunk of the source mesh, so use tasks.
		Array<ChartGroup *> chartGroups;
		chartGroups.resize(mesh->faceGroupCount() + (mesh->ignoredFaceCount() > 0 ? 1 : 0));
		Array<CreateChartGroupTaskArgs> taskArgs;
		taskArgs.resize(chartGroups.size());
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			CreateChartGroupTaskArgs &args = taskArgs[g];
			args.chartGroup = &chartGroups[g];
			args.faceGroup = uint16_t(g < mesh->faceGroupCount() ? g : Mesh::kInvalidFaceGroup);
			args.groupId = g;
			args.mesh = mesh;
		}
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartGroups.size());
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			Task task;
			task.userData = &taskArgs[g];
			task.func = runCreateChartGroupTask;
			taskScheduler->run(taskGroup, task);
		}
		taskScheduler->wait(&taskGroup);
		// Thread-safe append.
		m_addMeshMutex.lock();
		for (uint32_t g = 0; g < chartGroups.size(); g++) {
			m_chartGroups.push_back(chartGroups[g]);
			m_chartGroupSourceMeshes.push_back(mesh->id());
		}
		m_meshCount++;
		m_addMeshMutex.unlock();
	}